

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights_test.cpp
# Opt level: O1

void __thiscall SpotLight_Power_Test::TestBody(SpotLight_Power_Test *this)

{
  double dVar1;
  undefined8 uVar2;
  int i;
  Allocator alloc;
  long lVar3;
  ulong uVar4;
  char *message;
  int i_1;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 uVar11;
  undefined4 uVar12;
  undefined1 auVar10 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 in_XMM6_Da;
  undefined4 in_XMM6_Db;
  undefined8 in_XMM6_Qb;
  SampledSpectrum SVar15;
  Vector3f wl;
  Float invBase_1;
  Float invBase;
  AssertionResult gtest_ar;
  SampledWavelengths lambda;
  SpotLight light;
  Transform id;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  double local_210;
  AssertHelper local_208;
  double local_200;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  internal local_1e8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  undefined1 local_1d8 [16];
  double local_1c0;
  undefined8 local_1b8;
  undefined1 local_1a8 [16];
  float afStack_198 [6];
  SpectrumHandle local_180;
  SpotLight local_178;
  Transform local_a8;
  
  if (TestBody()::I == '\0') {
    TestBody();
  }
  pbrt::Transform::Transform(&local_a8);
  local_1a8._0_8_ = 0;
  local_1a8._8_8_ = 0;
  local_180.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )0x1000002f45750;
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::SpotLight::SpotLight
            (&local_178,&local_a8,(MediumInterface *)local_1a8,&local_180,1.0,60.0,40.0,alloc);
  local_1a8._8_8_ = 0;
  local_1a8._0_8_ = 0x4414c000;
  lVar3 = 1;
  fVar7 = 595.0;
  do {
    fVar7 = fVar7 + 117.5;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar7),SUB6416(ZEXT464(0x444f8000),0),0xe);
    bVar6 = (bool)((byte)uVar2 & 1);
    fVar7 = (float)((uint)bVar6 * (int)(fVar7 + -830.0 + 360.0) + (uint)!bVar6 * (int)fVar7);
    *(float *)(local_1a8 + lVar3 * 4) = fVar7;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  afStack_198[0] = 0.0021276595;
  afStack_198[1] = 0.0021276595;
  afStack_198[2] = 0.0021276595;
  afStack_198[3] = 0.0021276595;
  uVar11 = 0x3b0b7034;
  uVar12 = 0x3b0b7034;
  SVar15 = pbrt::SpotLight::Phi(&local_178,(SampledWavelengths *)local_1a8);
  local_1b8 = SVar15.values.values._0_8_;
  local_1a8._4_4_ = uVar12;
  local_1a8._0_4_ = uVar11;
  local_1f0 = 0.5;
  local_1f4 = 0.33333334;
  auVar10 = ZEXT464(0) << 0x20;
  uVar5 = 0;
  do {
    local_1c0 = auVar10._0_8_;
    auVar8 = ZEXT816(0) << 0x40;
    auVar14 = SUB6416(ZEXT464(0x3f800000),0);
    if (uVar5 != 0) {
      auVar10 = ZEXT1664(auVar14);
      lVar3 = 0;
      uVar4 = uVar5;
      do {
        lVar3 = (lVar3 - uVar4 / 2) * 2 + uVar4;
        fVar7 = local_1f0 * auVar10._0_4_;
        auVar10 = ZEXT464((uint)fVar7);
        bVar6 = 1 < uVar4;
        uVar4 = uVar4 / 2;
      } while (bVar6);
      auVar8._4_4_ = in_XMM6_Db;
      auVar8._0_4_ = in_XMM6_Da;
      auVar8._8_8_ = in_XMM6_Qb;
      auVar8 = vcvtusi2ss_avx512f(auVar8,lVar3);
      auVar8 = ZEXT416((uint)(fVar7 * auVar8._0_4_));
    }
    if (uVar5 == 0) {
      auVar13 = ZEXT816(0) << 0x40;
    }
    else {
      auVar10 = ZEXT1664(auVar14);
      lVar3 = 0;
      uVar4 = uVar5;
      do {
        lVar3 = (lVar3 - uVar4 / 3) * 3 + uVar4;
        fVar7 = local_1f4 * auVar10._0_4_;
        auVar10 = ZEXT464((uint)fVar7);
        bVar6 = 2 < uVar4;
        uVar4 = uVar4 / 3;
      } while (bVar6);
      auVar13._4_4_ = in_XMM6_Db;
      auVar13._0_4_ = in_XMM6_Da;
      auVar13._8_8_ = in_XMM6_Qb;
      auVar13 = vcvtusi2ss_avx512f(auVar13,lVar3);
      auVar13 = ZEXT416((uint)(fVar7 * auVar13._0_4_));
    }
    auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar8);
    auVar8 = vfmadd132ss_fma(auVar8,auVar14,ZEXT416(0xc0000000));
    local_200 = (double)CONCAT44(local_200._4_4_,auVar8._0_4_);
    auVar8 = vfnmadd213ss_fma(auVar8,auVar8,auVar14);
    auVar8 = vmaxss_avx(auVar8,ZEXT816(0));
    if (auVar8._0_4_ < 0.0) {
      local_1d8._0_4_ = auVar13._0_4_;
      fVar7 = sqrtf(auVar8._0_4_);
      auVar13 = ZEXT416((uint)local_1d8._0_4_);
    }
    else {
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar7 = auVar8._0_4_;
    }
    local_210 = (double)CONCAT44(local_210._4_4_,fVar7);
    auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar13);
    local_1ec = auVar8._0_4_ * 6.2831855;
    fVar7 = cosf(local_1ec);
    local_1d8 = ZEXT416((uint)(fVar7 * local_210._0_4_));
    fVar7 = sinf(local_1ec);
    auVar8 = vinsertps_avx(local_1d8,ZEXT416((uint)(fVar7 * local_210._0_4_)),0x10);
    wl.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar8._0_8_;
    wl.super_Tuple3<pbrt::Vector3,_float>.z = local_200._0_4_;
    SVar15 = pbrt::SpotLight::I(&local_178,wl,(SampledWavelengths *)local_1a8);
    dVar1 = local_1c0 + (double)SVar15.values.values[0];
    auVar10 = ZEXT864((ulong)dVar1);
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x100000);
  local_210 = dVar1 / 83443.0234375;
  local_200 = (double)(float)local_1b8;
  auVar14._8_8_ = 0x7fffffffffffffff;
  auVar14._0_8_ = 0x7fffffffffffffff;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_210 - local_200;
  auVar8 = vandpd_avx512vl(auVar9,auVar14);
  local_218.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       vmovlpd_avx(auVar8);
  local_208.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
  testing::internal::CmpHelperLT<double,double>
            (local_1e8,"std::abs(phiSampled - phi[0])","1e-3",(double *)&local_218,
             (double *)&local_208);
  if (local_1e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_218.ptr_ + 0x10)," qmc: ",6);
    std::ostream::_M_insert<double>(local_210);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_218.ptr_ + 0x10),", closed-form: ",0xf);
    std::ostream::_M_insert<double>(local_200);
    if (local_1e0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_1e0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights_test.cpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    if (local_218.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         (local_218.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_218.ptr_ + 8))();
      }
      local_218.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_178.Iemit.values);
  return;
}

Assistant:

TEST(SpotLight, Power) {
    static ConstantSpectrum I(10.);
    Transform id;
    SpotLight light(id, MediumInterface(), &I, 1.f /* scale */, 60 /* total width */,
                    40 /* falloff start */, Allocator());

    SampledWavelengths lambda = SampledWavelengths::SampleUniform(0.5);
    SampledSpectrum phi = light.Phi(lambda);

    int nSamples = 1024 * 1024;
    double phiSampled = 0;
    for (int i = 0; i < nSamples; ++i) {
        Vector3f w = SampleUniformSphere({RadicalInverse(0, i), RadicalInverse(1, i)});
        phiSampled += light.I(w, lambda)[0];
    }
    phiSampled /= (nSamples * UniformSpherePDF());

    EXPECT_LT(std::abs(phiSampled - phi[0]), 1e-3)
        << " qmc: " << phiSampled << ", closed-form: " << phi[0];
}